

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbox2d.cpp
# Opt level: O2

obb * __thiscall
masc::polygon::bbox2d::build(obb *__return_storage_ptr__,bbox2d *this,bbox2d_problem *problem)

{
  Point<double,_2> *pPVar1;
  pointer pPVar2;
  Point<double,_2> *other;
  double dVar3;
  double dVar4;
  int iVar5;
  ulong uVar6;
  Vector<double,_2> *this_00;
  long lVar7;
  int iVar8;
  Vector<double,_2> *pVVar9;
  ulong uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint in_XMM3_Da;
  uint in_XMM3_Db;
  uint in_XMM3_Dc;
  uint in_XMM3_Dd;
  Vector<double,_2> local_138;
  Vector<double,_2> local_128;
  float local_114;
  bbox2d_problem *local_110;
  float local_108;
  float fStack_104;
  uint uStack_100;
  uint uStack_fc;
  undefined8 local_f8;
  uint uStack_f0;
  uint uStack_ec;
  int e [4];
  Vector2d nev;
  float a [4];
  obb box;
  
  this_00 = &local_128;
  local_128.v[0] = 0.0;
  local_128.v[1] = 0.0;
  pPVar1 = (this->m_chull).
           super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->m_chull).
           super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  e[0] = 0;
  local_110 = problem;
  mathtool::Point<double,_2>::operator-(pPVar1 + 1,pPVar1);
  mathtool::Vector<double,_2>::normalize(this_00);
  local_138.v[0] = -local_128.v[1];
  local_138.v[1] = local_128.v[0];
  iVar8 = (int)((ulong)((long)pPVar2 - (long)pPVar1) >> 4);
  fVar13 = -3.4028235e+38;
  fVar14 = -3.4028235e+38;
  uVar16 = 0;
  uVar17 = 0;
  fVar12 = 3.4028235e+38;
  lVar7 = 0x20;
  for (pVVar9 = (Vector<double,_2> *)0x2; (long)pVVar9 < (long)iVar8;
      pVVar9 = (Vector<double,_2> *)((long)pVVar9->v + 1)) {
    local_f8 = CONCAT44(in_XMM3_Db,in_XMM3_Da);
    other = (this->m_chull).
            super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (Point<double,_2> *)((long)other->v + lVar7);
    local_114 = fVar12;
    local_108 = fVar13;
    fStack_104 = fVar14;
    uStack_100 = uVar16;
    uStack_fc = uVar17;
    uStack_f0 = in_XMM3_Dc;
    uStack_ec = in_XMM3_Dd;
    mathtool::Point<double,_2>::operator-(pPVar1,other);
    dVar3 = mathtool::Vector<double,_2>::operator*((Vector<double,_2> *)&box,&local_128);
    mathtool::Point<double,_2>::operator-
              (pPVar1,(this->m_chull).
                      super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    dVar4 = mathtool::Vector<double,_2>::operator*((Vector<double,_2> *)&box,&local_138);
    if (dVar3 < (double)local_114) {
      this_00 = pVVar9;
    }
    this_00 = (Vector<double,_2> *)((ulong)this_00 & 0xffffffff);
    fVar12 = (float)dVar3;
    if ((double)local_114 <= dVar3) {
      fVar12 = local_114;
    }
    uVar11 = -(uint)((double)local_108 < dVar3);
    uVar15 = (uint)-(ulong)((double)fStack_104 < dVar4);
    uVar17 = (uint)(-(ulong)((double)fStack_104 < dVar4) >> 0x20);
    in_XMM3_Dc = ~uVar15 & uStack_f0;
    in_XMM3_Dd = ~uVar17 & uStack_ec;
    in_XMM3_Da = (uint)pVVar9 & uVar11 | ~uVar11 & (uint)local_f8;
    in_XMM3_Db = (uint)pVVar9 & uVar15 | ~uVar15 & local_f8._4_4_;
    uVar16 = ~uVar15 & uStack_100;
    uVar17 = ~uVar17 & uStack_fc;
    fVar13 = (float)(~uVar11 & (uint)local_108 | (uint)(float)dVar3 & uVar11);
    fVar14 = (float)(~uVar15 & (uint)fStack_104 | (uint)(float)dVar4 & uVar15);
    lVar7 = lVar7 + 0x10;
  }
  e[3] = (int)this_00;
  e[1] = in_XMM3_Da;
  e[2] = in_XMM3_Db;
  local_108 = (float)findAngles(this,e,a,&local_128,&local_138);
  uVar6 = 0;
  while (uVar6 < (ulong)((long)(this->m_chull).
                               super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_chull).
                               super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    createOBB(&box,this,e,&local_128,&local_138);
    iVar5 = (**local_110->_vptr_bbox2d_problem)(local_110,&box);
    fVar13 = local_108;
    if ((char)iVar5 != '\0') break;
    uVar10 = (ulong)(uint)local_108;
    iVar5 = (e[uVar10] + 1) % iVar8;
    pPVar2 = (this->m_chull).
             super__Vector_base<mathtool::Point<double,_2>,_std::allocator<mathtool::Point<double,_2>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8 = uVar6;
    mathtool::Point<double,_2>::operator-(pPVar2 + iVar5,pPVar2 + e[uVar10]);
    mathtool::Vector<double,_2>::normalize(&nev);
    if (((uint)fVar13 & 1) == 0) {
      local_128.v[0] = nev.v[0];
      local_128.v[1] = nev.v[1];
      local_138.v[0] = -nev.v[1];
      local_138.v[1] = nev.v[0];
    }
    else {
      local_138.v[0] = nev.v[0];
      local_138.v[1] = nev.v[1];
      local_128.v[0] = -nev.v[1];
      local_128.v[1] = nev.v[0];
    }
    e[uVar10] = iVar5;
    local_108 = (float)findAngles(this,e,a,&local_128,&local_138);
    uVar6 = local_f8 + 1;
  }
  obb::obb(__return_storage_ptr__,&local_110->m_solution);
  return __return_storage_ptr__;
}

Assistant:

obb bbox2d::build(bbox2d_problem & problem)
{
  mathtool::Vector2d v,n;
  int e[4]; //vertex indices of extreme points
  float a[4]; //angles
  int w; //index (0~3), so that e[w] has the smallest value a[w]
  int hullsize=m_chull.size();

  //init extreme points
  e[0]=0;
  v=(m_chull[1]-m_chull[0]).normalize();
  n.set(-v[1],v[0]);
  const mathtool::Vector2d v0=v;

  float max_v=-FLT_MAX, min_v=FLT_MAX, max_n=-FLT_MAX;
  for(int i=2;i<hullsize;i++)
  {
    auto& pt=m_chull[i];
    double dv=(pt-m_chull[0])*v;
    double dn=(pt-m_chull[0])*n;
    if(dv>max_v){ max_v=dv; e[1]=i;}
    if(dv<min_v){ min_v=dv; e[3]=i;}
    if(dn>max_n){ max_n=dn; e[2]=i;}
  }
  w=findAngles(e,a,v,n);

  //update extreme points
  char svg_filename[256];

  for(int i=0;i<m_chull.size();i++)
  {
    //create a box from v,n,e[4]
    obb box=createOBB(e,v,n);

#if DEBUG
    cout<<"box="<<box<<endl;
    sprintf(svg_filename, "%s%03d.svg", "DEBUG_",i);
    saveSVG(svg_filename,m_chull_ply,box);
    //saveSVG(svg_filename,m_ply.front(),box);
#endif

    //check if this box solve the problem
    if(problem.solved(box)) break;

    //update
    int ne=(e[w]+1)%hullsize;
    mathtool::Vector2d nev=(m_chull[ne]-m_chull[e[w]]).normalize();
    if(w==0 || w==2)
    {
      v=nev;
      n.set(-v[1],v[0]);
    }
    else{
      n=nev;
      v.set(-n[1],n[0]);
    }
    e[w]=ne;

    w=findAngles(e,a,v,n);
  }

  return problem.getSolution(); //done
}